

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O2

bool __thiscall xmrig::Arguments::hasArg(Arguments *this,char *name)

{
  __normal_iterator<const_xmrig::String_*,_std::vector<xmrig::String,_std::allocator<xmrig::String>_>_>
  _Var1;
  bool bVar2;
  char *local_10;
  
  if (this->m_argc == 1) {
    bVar2 = false;
  }
  else {
    local_10 = name;
    _Var1 = std::
            __find_if<__gnu_cxx::__normal_iterator<xmrig::String_const*,std::vector<xmrig::String,std::allocator<xmrig::String>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                      ((this->m_data).
                       super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>._M_impl.
                       super__Vector_impl_data._M_start + 1,
                       (this->m_data).
                       super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_10);
    bVar2 = _Var1._M_current !=
            (this->m_data).super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>._M_impl
            .super__Vector_impl_data._M_finish;
  }
  return bVar2;
}

Assistant:

bool xmrig::Arguments::hasArg(const char *name) const
{
    if (m_argc == 1) {
        return false;
    }

    return std::find(m_data.begin() + 1, m_data.end(), name) != m_data.end();
}